

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolUDP.cpp
# Opt level: O0

void __thiscall
ProtocolUDP::ProcessRx(ProtocolUDP *this,DataBuffer *buffer,uint8_t *sourceIP,uint8_t *targetIP)

{
  uint16_t uVar1;
  size_t sVar2;
  uint16_t targetPort;
  uint8_t *targetIP_local;
  uint8_t *sourceIP_local;
  DataBuffer *buffer_local;
  ProtocolUDP *this_local;
  
  uVar1 = Unpack16(buffer->Packet,2);
  sVar2 = header_size();
  buffer->Packet = buffer->Packet + sVar2;
  sVar2 = header_size();
  buffer->Remainder = buffer->Remainder - (short)sVar2;
  if (uVar1 == 0x44) {
    ProtocolDHCP::ProcessRx(this->DHCP,buffer);
  }
  return;
}

Assistant:

void ProtocolUDP::ProcessRx(DataBuffer* buffer, const uint8_t* sourceIP, const uint8_t* targetIP)
{
    // uint16_t sourcePort = Unpack16(buffer->Packet, 0);
    uint16_t targetPort = Unpack16(buffer->Packet, 2);

    buffer->Packet += header_size();
    buffer->Remainder -= header_size();

    switch (targetPort)
    {
    case 68: // DHCP Client Port
        DHCP.ProcessRx(buffer);
        break;
    default:
        // printf( "Rx UDP target port %d\n", targetPort );
        break;
    }
}